

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_move16_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t uVar2;
  TCGv_i32 ret;
  TCGv_i32 *ppTVar3;
  TCGv_i32 *ppTVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = ((s->base).tb)->flags;
  uVar2 = read_im16(env,s);
  if (-1 < (short)uVar2) {
    gen_exception(s,(s->base).pc_next,4);
  }
  uVar7 = uVar2 >> 0xc & 7;
  uVar6 = 1 << (sbyte)uVar7;
  if (((uint)s->writeback_mask >> uVar7 & 1) == 0) {
    ppTVar3 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar3 = s->writeback;
  }
  uVar5 = insn & 7;
  if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar4 = s->writeback;
  }
  m68k_copy_line(tcg_ctx,ppTVar3[uVar7],ppTVar4[uVar5],(uint)((uVar1 >> 0xd & 1) == 0));
  ret = tcg_temp_new_i32(tcg_ctx);
  if ((s->writeback_mask & uVar6) == 0) {
    ppTVar3 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar3 = s->writeback;
  }
  tcg_gen_mov_i32(tcg_ctx,ret,ppTVar3[uVar7]);
  if ((s->writeback_mask & 1 << (sbyte)uVar5) == 0) {
    ppTVar3 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar3 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar3[uVar5],ppTVar3[uVar5],0x10);
  if ((s->writeback_mask & uVar6) == 0) {
    ppTVar3 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar3 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar3[uVar7],ret,0x10);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(move16_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int index = IS_USER(s);
    TCGv tmp;
    uint16_t ext;

    ext = read_im16(env, s);
    if ((ext & (1 << 15)) == 0) {
        gen_exception(s, s->base.pc_next, EXCP_ILLEGAL);
    }

    m68k_copy_line(tcg_ctx, AREG(ext, 12), AREG(insn, 0), index);

    /* Ax can be Ay, so save Ay before incrementing Ax */
    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_mov_i32(tcg_ctx, tmp, AREG(ext, 12));
    tcg_gen_addi_i32(tcg_ctx, AREG(insn, 0), AREG(insn, 0), 16);
    tcg_gen_addi_i32(tcg_ctx, AREG(ext, 12), tmp, 16);
    tcg_temp_free(tcg_ctx, tmp);
}